

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O1

bool __thiscall draco::PointCloudEncoder::RearrangeAttributesEncoders(PointCloudEncoder *this)

{
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> _Var1;
  AttributesEncoder *pAVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  pointer puVar7;
  ulong uVar8;
  allocator_type *__a;
  long lVar9;
  undefined4 uVar10;
  ulong uVar11;
  ulong uVar12;
  int ap;
  int iVar13;
  uint uVar14;
  int p;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  vector<bool,_std::allocator<bool>_> is_attribute_processed;
  vector<bool,_std::allocator<bool>_> is_encoder_processed;
  vector<int,_std::allocator<int>_> attribute_encoding_order;
  allocator_type local_e2;
  bool local_e1;
  ulong local_e0;
  ulong local_d8;
  undefined4 local_cc;
  ulong local_c8;
  ulong local_c0;
  vector<bool,_std::allocator<bool>_> local_b8;
  vector<bool,_std::allocator<bool>_> local_90;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = &this->attributes_encoder_ids_order_;
  std::vector<int,_std::allocator<int>_>::resize
            (local_50,(long)(this->attributes_encoders_).
                            super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->attributes_encoders_).
                            super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_90,
             (long)(this->attributes_encoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->attributes_encoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_b8,
             (allocator_type *)&local_68);
  uVar8 = 0;
  do {
    if ((ulong)((long)(this->attributes_encoders_).
                      super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->attributes_encoders_).
                      super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar8) {
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_e1 = false;
      __a = &local_e2;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&local_b8,
                 (long)(int)((ulong)((long)(this->point_cloud_->attributes_).
                                           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->point_cloud_->attributes_).
                                          super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3),&local_e1
                 ,__a);
      puVar7 = (this->attributes_encoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar17 = (this->attributes_encoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish == puVar7;
      local_cc = (undefined4)CONCAT71((int7)((ulong)__a >> 8),bVar17);
      if (bVar17) goto LAB_00147573;
      uVar8 = 0;
      goto LAB_00147369;
    }
    uVar16 = 0;
    if ((this->attributes_encoders_).
        super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->attributes_encoders_).
        super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar12 = 0;
      uVar11 = uVar16;
    }
    else {
      local_e0 = 0;
      do {
        uVar15 = (uint)uVar16;
        uVar11 = 1L << ((byte)uVar16 & 0x3f);
        uVar12 = uVar16 >> 6;
        if ((local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar12] >> (uVar16 & 0x3f) & 1) == 0) {
          _Var1._M_t.
          super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
          .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
               (this->attributes_encoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_t.
               super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
               ._M_t;
          lVar9 = *(long *)((long)_Var1._M_t.
                                  super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                  .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                  _M_head_impl + 8);
          if ((int)((ulong)(*(long *)((long)_Var1._M_t.
                                            super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                            .
                                            super__Head_base<0UL,_draco::AttributesEncoder_*,_false>
                                            ._M_head_impl + 0x10) - lVar9) >> 2) != 0) {
            local_c0 = CONCAT44(local_c0._4_4_,(int)uVar8);
            bVar17 = true;
            uVar14 = 0;
            local_d8 = uVar12;
            local_c8 = uVar11;
            do {
              uVar10 = *(undefined4 *)(lVar9 + (long)(int)uVar14 * 4);
              iVar13 = 0;
              do {
                _Var1._M_t.
                super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
                     (this->attributes_encoders_).
                     super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_t.
                     super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                     ._M_t;
                iVar4 = (**(code **)(*(long *)_Var1._M_t.
                                              super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                              .
                                              super__Head_base<0UL,_draco::AttributesEncoder_*,_false>
                                              ._M_head_impl + 0x30))
                                  (_Var1._M_t.
                                   super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                   .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                   _M_head_impl,uVar10);
                if (iVar4 <= iVar13) break;
                _Var1._M_t.
                super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
                     (this->attributes_encoders_).
                     super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_t.
                     super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                     ._M_t;
                uVar5 = (**(code **)(*(long *)_Var1._M_t.
                                              super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                              .
                                              super__Head_base<0UL,_draco::AttributesEncoder_*,_false>
                                              ._M_head_impl + 0x38))
                                  (_Var1._M_t.
                                   super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                   .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                   _M_head_impl,uVar10,iVar13);
                if (uVar5 == uVar15) {
LAB_00147264:
                  bVar3 = true;
                }
                else {
                  uVar11 = (ulong)(this->attribute_to_encoder_map_).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar5];
                  uVar8 = uVar11 + 0x3f;
                  if (-1 < (long)uVar11) {
                    uVar8 = uVar11;
                  }
                  if ((local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar8 >> 6) +
                        ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                       (uVar11 & 0x3f) & 1) != 0) goto LAB_00147264;
                  bVar17 = false;
                  bVar3 = false;
                }
                iVar13 = iVar13 + 1;
              } while (bVar3);
              uVar14 = uVar14 + 1;
              _Var1._M_t.
              super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
              .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
                   (this->attributes_encoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_t.
                   super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                   ._M_t;
              lVar9 = *(long *)((long)_Var1._M_t.
                                      super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                      .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                      _M_head_impl + 8);
            } while (uVar14 < (uint)((ulong)(*(long *)((long)_Var1._M_t.
                                                                                                                          
                                                  super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                                  .
                                                  super__Head_base<0UL,_draco::AttributesEncoder_*,_false>
                                                  ._M_head_impl + 0x10) - lVar9) >> 2));
            uVar8 = local_c0 & 0xffffffff;
            uVar11 = local_c8;
            uVar12 = local_d8;
            if (!bVar17) goto LAB_001472d0;
          }
          (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[uVar8] = uVar15;
          uVar8 = (ulong)((int)uVar8 + 1);
          local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar12] =
               local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar12] | uVar11;
          local_e0 = CONCAT71((int7)((ulong)local_90.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p >> 8),1);
        }
LAB_001472d0:
        uVar16 = (ulong)(uVar15 + 1);
        uVar12 = (long)(this->attributes_encoders_).
                       super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->attributes_encoders_).
                       super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        uVar11 = local_e0;
      } while (uVar16 < uVar12);
    }
  } while (((uVar11 & 1) != 0) || (uVar12 <= uVar8));
  uVar10 = 0;
  goto LAB_001475c4;
  while( true ) {
    uVar8 = (ulong)((int)local_40 + 1);
    puVar7 = (this->attributes_encoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar9 = (long)(this->attributes_encoders_).
                  super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7;
    uVar16 = lVar9 >> 3;
    local_cc = (undefined4)CONCAT71((int7)(lVar9 >> 0xb),uVar16 <= uVar8);
    if (uVar16 <= uVar8) break;
LAB_00147369:
    iVar13 = (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar8];
    pAVar2 = puVar7[iVar13]._M_t.
             super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
             .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl;
    uVar16 = (ulong)((long)*(pointer *)
                            ((long)&(pAVar2->point_attribute_ids_).
                                    super__Vector_base<int,_std::allocator<int>_> + 8) -
                    *(long *)&(pAVar2->point_attribute_ids_).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl) >> 2;
    iVar4 = 0xf;
    uVar15 = (uint)uVar16;
    local_40 = uVar8;
    if (1 < (int)uVar15) {
      std::vector<int,_std::allocator<int>_>::resize(&local_68,(ulong)(uVar15 & 0x7fffffff));
      uVar11 = (ulong)(uVar15 & 0x7fffffff);
      uVar8 = 0;
      local_e0 = uVar11;
      local_38 = uVar16;
      do {
        if ((int)local_38 <= (int)uVar8) {
          iVar4 = 0;
          AttributesEncoder::SetAttributeIds
                    ((AttributesEncoder *)
                     (this->attributes_encoders_).
                     super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar13]._M_t.
                     super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                     ._M_t,&local_68);
          goto LAB_0014753c;
        }
        uVar16 = 0;
        local_48 = 0;
        local_d8 = uVar8;
        do {
          if ((local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            uVar10 = *(undefined4 *)
                      (*(long *)((long)(this->attributes_encoders_).
                                       super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[iVar13]._M_t.
                                       super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                                       ._M_t + 8) + uVar16 * 4);
            iVar4 = 0;
            bVar17 = true;
            local_c8 = uVar16 >> 6;
            local_c0 = 1L << ((byte)uVar16 & 0x3f);
            do {
              _Var1._M_t.
              super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
              .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
                   (this->attributes_encoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar13]._M_t.
                   super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                   ._M_t;
              iVar6 = (**(code **)(*(long *)_Var1._M_t.
                                            super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                            .
                                            super__Head_base<0UL,_draco::AttributesEncoder_*,_false>
                                            ._M_head_impl + 0x30))
                                (_Var1._M_t.
                                 super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                 .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                 _M_head_impl,uVar10);
              if (iVar6 <= iVar4) goto LAB_001474a9;
              _Var1._M_t.
              super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
              .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
                   (this->attributes_encoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar13]._M_t.
                   super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                   ._M_t;
              iVar6 = (**(code **)(*(long *)_Var1._M_t.
                                            super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                            .
                                            super__Head_base<0UL,_draco::AttributesEncoder_*,_false>
                                            ._M_head_impl + 0x38))
                                (_Var1._M_t.
                                 super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                 .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                 _M_head_impl,uVar10,iVar4);
              uVar11 = (ulong)iVar6;
              uVar8 = uVar11 + 0x3f;
              if (-1 < (long)uVar11) {
                uVar8 = uVar11;
              }
              iVar4 = iVar4 + 1;
            } while ((local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      [((long)uVar8 >> 6) +
                       ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                      (uVar11 & 0x3f) & 1) != 0);
            bVar17 = false;
LAB_001474a9:
            uVar11 = local_e0;
            if (bVar17) {
              local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[(int)local_d8] = (int)uVar16;
              local_d8 = (ulong)((int)local_d8 + 1);
              local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[local_c8] =
                   local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_c8] |
                   local_c0;
              local_48 = CONCAT71((int7)((ulong)local_b8.super__Bvector_base<std::allocator<bool>_>.
                                                _M_impl.super__Bvector_impl_data._M_start.
                                                super__Bit_iterator_base._M_p >> 8),1);
            }
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar11);
        uVar8 = local_d8;
      } while (((local_48 & 1) != 0) || ((int)local_38 <= (int)local_d8));
      iVar4 = 1;
    }
LAB_0014753c:
    if ((iVar4 != 0xf) && (iVar4 != 0)) break;
  }
LAB_00147573:
  if (local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  uVar10 = local_cc;
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_001475c4:
  if (local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return (bool)((byte)uVar10 & 1);
}

Assistant:

bool PointCloudEncoder::RearrangeAttributesEncoders() {
  // Find the encoding order of the attribute encoders that is determined by
  // the parent dependencies between individual encoders. Instead of traversing
  // a graph we encode the attributes in multiple iterations where encoding of
  // attributes that depend on other attributes may get postponed until the
  // parent attributes are processed.
  // This is simpler to implement than graph traversal and it automatically
  // detects any cycles in the dependency graph.
  // TODO(ostava): Current implementation needs to encode all attributes of a
  // single encoder to be encoded in a single "chunk", therefore we need to sort
  // attribute encoders before we sort individual attributes. This requirement
  // can be lifted for encoders that can encode individual attributes separately
  // but it will require changes in the current API.
  attributes_encoder_ids_order_.resize(attributes_encoders_.size());
  std::vector<bool> is_encoder_processed(attributes_encoders_.size(), false);
  uint32_t num_processed_encoders = 0;
  while (num_processed_encoders < attributes_encoders_.size()) {
    // Flagged when any of the encoder get processed.
    bool encoder_processed = false;
    for (uint32_t i = 0; i < attributes_encoders_.size(); ++i) {
      if (is_encoder_processed[i]) {
        continue;  // Encoder already processed.
      }
      // Check if all parent encoders are already processed.
      bool can_be_processed = true;
      for (uint32_t p = 0; p < attributes_encoders_[i]->num_attributes(); ++p) {
        const int32_t att_id = attributes_encoders_[i]->GetAttributeId(p);
        for (int ap = 0;
             ap < attributes_encoders_[i]->NumParentAttributes(att_id); ++ap) {
          const uint32_t parent_att_id =
              attributes_encoders_[i]->GetParentAttributeId(att_id, ap);
          const int32_t parent_encoder_id =
              attribute_to_encoder_map_[parent_att_id];
          if (parent_att_id != i && !is_encoder_processed[parent_encoder_id]) {
            can_be_processed = false;
            break;
          }
        }
      }
      if (!can_be_processed) {
        continue;  // Try to process the encoder in the next iteration.
      }
      // Encoder can be processed. Update the encoding order.
      attributes_encoder_ids_order_[num_processed_encoders++] = i;
      is_encoder_processed[i] = true;
      encoder_processed = true;
    }
    if (!encoder_processed &&
        num_processed_encoders < attributes_encoders_.size()) {
      // No encoder was processed but there are still some remaining unprocessed
      // encoders.
      return false;
    }
  }

  // Now for every encoder, reorder the attributes to satisfy their
  // dependencies (an attribute may still depend on other attributes within an
  // encoder).
  std::vector<int32_t> attribute_encoding_order;
  std::vector<bool> is_attribute_processed(point_cloud_->num_attributes(),
                                           false);
  int num_processed_attributes;
  for (uint32_t ae_order = 0; ae_order < attributes_encoders_.size();
       ++ae_order) {
    const int ae = attributes_encoder_ids_order_[ae_order];
    const int32_t num_encoder_attributes =
        attributes_encoders_[ae]->num_attributes();
    if (num_encoder_attributes < 2) {
      continue;  // No need to resolve dependencies for a single attribute.
    }
    num_processed_attributes = 0;
    attribute_encoding_order.resize(num_encoder_attributes);
    while (num_processed_attributes < num_encoder_attributes) {
      // Flagged when any of the attributes get processed.
      bool attribute_processed = false;
      for (int i = 0; i < num_encoder_attributes; ++i) {
        const int32_t att_id = attributes_encoders_[ae]->GetAttributeId(i);
        if (is_attribute_processed[i]) {
          continue;  // Attribute already processed.
        }
        // Check if all parent attributes are already processed.
        bool can_be_processed = true;
        for (int p = 0;
             p < attributes_encoders_[ae]->NumParentAttributes(att_id); ++p) {
          const int32_t parent_att_id =
              attributes_encoders_[ae]->GetParentAttributeId(att_id, p);
          if (!is_attribute_processed[parent_att_id]) {
            can_be_processed = false;
            break;
          }
        }
        if (!can_be_processed) {
          continue;  // Try to process the attribute in the next iteration.
        }
        // Attribute can be processed. Update the encoding order.
        attribute_encoding_order[num_processed_attributes++] = i;
        is_attribute_processed[i] = true;
        attribute_processed = true;
      }
      if (!attribute_processed &&
          num_processed_attributes < num_encoder_attributes) {
        // No attribute was processed but there are still some remaining
        // unprocessed attributes.
        return false;
      }
    }
    // Update the order of the attributes within the encoder.
    attributes_encoders_[ae]->SetAttributeIds(attribute_encoding_order);
  }
  return true;
}